

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

char * SHA256_End(SHA256_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  sha2_byte digest [32];
  byte local_28 [32];
  
  if (context != (SHA256_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      context->buffer[0] = '\0';
      context->buffer[1] = '\0';
      context->buffer[2] = '\0';
      context->buffer[3] = '\0';
      context->buffer[4] = '\0';
      context->buffer[5] = '\0';
      context->buffer[6] = '\0';
      context->buffer[7] = '\0';
      context->buffer[8] = '\0';
      context->buffer[9] = '\0';
      context->buffer[10] = '\0';
      context->buffer[0xb] = '\0';
      context->buffer[0xc] = '\0';
      context->buffer[0xd] = '\0';
      context->buffer[0xe] = '\0';
      context->buffer[0xf] = '\0';
      context->buffer[0x10] = '\0';
      context->buffer[0x11] = '\0';
      context->buffer[0x12] = '\0';
      context->buffer[0x13] = '\0';
      context->buffer[0x14] = '\0';
      context->buffer[0x15] = '\0';
      context->buffer[0x16] = '\0';
      context->buffer[0x17] = '\0';
      context->buffer[0x18] = '\0';
      context->buffer[0x19] = '\0';
      context->buffer[0x1a] = '\0';
      context->buffer[0x1b] = '\0';
      context->buffer[0x1c] = '\0';
      context->buffer[0x1d] = '\0';
      context->buffer[0x1e] = '\0';
      context->buffer[0x1f] = '\0';
      context->buffer[0x20] = '\0';
      context->buffer[0x21] = '\0';
      context->buffer[0x22] = '\0';
      context->buffer[0x23] = '\0';
      context->buffer[0x24] = '\0';
      context->buffer[0x25] = '\0';
      context->buffer[0x26] = '\0';
      context->buffer[0x27] = '\0';
      context->buffer[0x28] = '\0';
      context->buffer[0x29] = '\0';
      context->buffer[0x2a] = '\0';
      context->buffer[0x2b] = '\0';
      context->buffer[0x2c] = '\0';
      context->buffer[0x2d] = '\0';
      context->buffer[0x2e] = '\0';
      context->buffer[0x2f] = '\0';
      context->buffer[0x30] = '\0';
      context->buffer[0x31] = '\0';
      context->buffer[0x32] = '\0';
      context->buffer[0x33] = '\0';
      context->buffer[0x34] = '\0';
      context->buffer[0x35] = '\0';
      context->buffer[0x36] = '\0';
      context->buffer[0x37] = '\0';
      context->buffer[0x38] = '\0';
      context->buffer[0x39] = '\0';
      context->buffer[0x3a] = '\0';
      context->buffer[0x3b] = '\0';
      context->buffer[0x3c] = '\0';
      context->buffer[0x3d] = '\0';
      context->buffer[0x3e] = '\0';
      context->buffer[0x3f] = '\0';
      context->state[0] = 0;
      context->state[1] = 0;
      context->state[2] = 0;
      context->state[3] = 0;
      context->state[4] = 0;
      context->state[5] = 0;
      context->state[6] = 0;
      context->state[7] = 0;
      context->bitcount = 0;
      context->buffer[0] = '\0';
      context->buffer[1] = '\0';
      context->buffer[2] = '\0';
      context->buffer[3] = '\0';
      context->buffer[4] = '\0';
      context->buffer[5] = '\0';
      context->buffer[6] = '\0';
      context->buffer[7] = '\0';
      context->buffer[8] = '\0';
      context->buffer[9] = '\0';
      context->buffer[10] = '\0';
      context->buffer[0xb] = '\0';
      context->buffer[0xc] = '\0';
      context->buffer[0xd] = '\0';
      context->buffer[0xe] = '\0';
      context->buffer[0xf] = '\0';
      context->buffer[0x10] = '\0';
      context->buffer[0x11] = '\0';
      context->buffer[0x12] = '\0';
      context->buffer[0x13] = '\0';
      context->buffer[0x14] = '\0';
      context->buffer[0x15] = '\0';
      context->buffer[0x16] = '\0';
      context->buffer[0x17] = '\0';
      pcVar4 = (char *)0x0;
    }
    else {
      SHA256_Final(local_28,(SHA256_CTX *)context);
      lVar2 = 0;
      lVar3 = 0;
      do {
        bVar1 = local_28[lVar3];
        buffer[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
        buffer[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + -2;
      } while (lVar3 != 0x20);
      buffer[0x40] = '\0';
      pcVar4 = buffer + -lVar2;
    }
    return pcVar4;
  }
  __assert_fail("context != (SHA256_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x275,"char *SHA256_End(SHA256_CTX *, char *)");
}

Assistant:

char *SHA256_End(SHA256_CTX* context, char buffer[SHA256_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0);

	if (buffer != (char*)0) {
		SHA256_Final(digest, context);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA256_CTX));
	}
	MEMSET_BZERO(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}